

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtaskqueue.h
# Opt level: O0

bool __thiscall
TaskQueue<std::shared_ptr<RenderTask>_>::pop
          (TaskQueue<std::shared_ptr<RenderTask>_> *this,shared_ptr<RenderTask> *task)

{
  bool bVar1;
  long in_RDI;
  lock_t lock;
  mutex_type *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  byte bVar2;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  bool local_1;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  while( true ) {
    bVar1 = std::deque<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>::
            empty((deque<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
                   *)0x1a71e0);
    bVar2 = 0;
    if (bVar1) {
      bVar2 = *(byte *)(in_RDI + 0x50) ^ 0xff;
    }
    if ((bVar2 & 1) == 0) break;
    std::condition_variable::wait((unique_lock *)(in_RDI + 0x80));
  }
  local_1 = std::deque<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>::
            empty((deque<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>
                   *)0x1a7229);
  if (!local_1) {
    std::deque<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>::front
              ((deque<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    std::shared_ptr<RenderTask>::operator=
              ((shared_ptr<RenderTask> *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),
               (shared_ptr<RenderTask> *)in_stack_ffffffffffffffb8);
    std::deque<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_>::
    pop_front((deque<std::shared_ptr<RenderTask>,_std::allocator<std::shared_ptr<RenderTask>_>_> *)
              CONCAT17(bVar2,in_stack_ffffffffffffffc0));
  }
  local_1 = !local_1;
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)CONCAT17(bVar2,in_stack_ffffffffffffffc0));
  return local_1;
}

Assistant:

bool pop(Task &task)
    {
        lock_t lock{_mutex};
        while (_q.empty() && !_done) _ready.wait(lock);
        if (_q.empty()) return false;
        task = std::move(_q.front());
        _q.pop_front();
        return true;
    }